

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void print_live_info(gen_ctx_t gen_ctx,char *title,int dead_var_p,int pressure_p)

{
  int bb_p;
  
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    if (dead_var_p != 0) {
      add_bb_insn_dead_vars(gen_ctx);
    }
    bb_p = 0x1ba8bd;
    fprintf((FILE *)gen_ctx->debug_file,"+++++++++++++%s:\n",title);
    print_loop_tree(gen_ctx,bb_p);
    print_CFG(gen_ctx,1,pressure_p,1,1,output_bb_live_info);
    return;
  }
  return;
}

Assistant:

static void print_live_info (gen_ctx_t gen_ctx, const char *title, int dead_var_p, int pressure_p) {
  DEBUG (2, {
    if (dead_var_p) add_bb_insn_dead_vars (gen_ctx);
    fprintf (debug_file, "+++++++++++++%s:\n", title);
    print_loop_tree (gen_ctx, TRUE);
    print_CFG (gen_ctx, TRUE, pressure_p, TRUE, TRUE, output_bb_live_info);
  });
}